

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FibHeap.h
# Opt level: O2

Node * __thiscall
FibHeap<std::pair<double,_int>_>::push
          (FibHeap<std::pair<double,_int>_> *this,pair<double,_int> *key)

{
  bool bVar1;
  pointer x;
  
  x = MemPool<FibHeap<std::pair<double,int>>::Node,4096>::newElem<std::pair<double,int>const&>
                ((MemPool<FibHeap<std::pair<double,int>>::Node,4096> *)this,key);
  Node::push(this->root,x);
  if ((this->min != (Node *)0x0) && (bVar1 = std::operator<(key,&this->min->key), !bVar1)) {
    return x;
  }
  this->min = x;
  return x;
}

Assistant:

Node *push(const K &key)
	{
		Node *x = alloc.newElem(key);
		root->push(x);
		if (!min || key < min->key)
			min = x;
		return x;
	}